

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O1

short __thiscall
libdivide::divider<short,_(libdivide::Branching)0>::recover
          (divider<short,_(libdivide::Branching)0> *this)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  ushort uVar4;
  uint8_t more;
  ushort uVar5;
  
  bVar1 = (this->div).denom.more;
  uVar5 = (this->div).denom.magic;
  if (uVar5 == 0) {
    uVar5 = (ushort)(1 << (bVar1 & 0x1f));
    uVar4 = -uVar5;
  }
  else {
    bVar2 = 0 < (short)uVar5;
    if ((bVar1 & 0x40) == 0) {
      bVar2 = (short)uVar5 < 0;
    }
    uVar3 = -(uint)uVar5;
    if (!bVar2) {
      uVar3 = (uint)uVar5;
    }
    uVar4 = (ushort)((ulong)(uint)(1 << ((byte)((char)(bVar1 & 0x1f) + 0x10) & 0x1f)) /
                    ((ulong)uVar3 & 0xffff));
    uVar5 = uVar4 + 1;
    uVar4 = ~uVar4;
  }
  if (-1 < (char)bVar1) {
    uVar4 = uVar5;
  }
  return uVar4;
}

Assistant:

T recover() const { return div.recover(); }